

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::_advance(Tree *this,lookup_result *r,size_t more)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  basic_substring<const_char> local_20;
  
  uVar3 = more + r->path_pos;
  r->path_pos = uVar3;
  if (uVar3 <= (r->path).len) {
    basic_substring<const_char>::basic_substring
              (&local_20,(r->path).str + uVar3,(r->path).len - uVar3);
    if ((local_20.len != 0) && (*local_20.str == '.')) {
      r->path_pos = r->path_pos + 1;
    }
    return;
  }
  if ((s_error_flags & 1) != 0) {
    bVar2 = is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  handle_error(0x1ff947,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

void Tree::_advance(lookup_result *r, size_t more) const
{
    r->path_pos += more;
    if(r->path.sub(r->path_pos).begins_with('.'))
        ++r->path_pos;
}